

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O3

int Smt_PrsCreateNode(Wlc_Ntk_t *pNtk,int Type,int fSigned,int Range,Vec_Int_t *vFanins,char *pName)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  undefined4 in_register_00000034;
  int iVar11;
  int fFound;
  char Buffer [100];
  int local_c0;
  uint local_bc;
  undefined8 local_b8;
  uint local_ac;
  char *local_a8;
  ulong local_a0;
  char local_98 [104];
  
  local_b8 = CONCAT44(in_register_00000034,Type);
  uVar9 = (ulong)(uint)Range;
  local_bc = fSigned;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 0x10;
  piVar8 = (int *)malloc(0x40);
  pVVar7->pArray = piVar8;
  pVVar7->nSize = 2;
  if (piVar8 != (int *)0x0) {
    piVar8[0] = -1;
    piVar8[1] = -1;
  }
  if ((int)(uint)local_b8 < 1) {
    __assert_fail("Type > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                  ,0x13b,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
  }
  if (Range < 0) {
    __assert_fail("Range >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                  ,0x13c,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
  }
  local_a0 = uVar9;
  if ((int)local_bc < 0) {
    __assert_fail("fSigned >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                  ,0x13d,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
  }
  if ((2 < vFanins->nSize) &&
     (((((uint)local_b8 - 0x2b < 4 || ((uint)local_b8 - 0x21 < 4)) || ((uint)local_b8 - 0x1b < 5))
      || ((((uint)local_b8 & 0x7ffffffc) == 0x10 || (((uint)local_b8 & 0x7ffffffe) == 0x14)))))) {
    local_ac = Range - 1;
    iVar11 = vFanins->nSize;
    local_a8 = pName;
    while (2 < iVar11) {
      vFanins->nSize = iVar11 - 1U;
      iVar1 = vFanins->pArray[iVar11 - 1U];
      vFanins->nSize = iVar11 - 2U;
      if (pVVar7->nSize < 1) goto LAB_0037265a;
      iVar2 = vFanins->pArray[iVar11 - 2U];
      piVar8 = pVVar7->pArray;
      *piVar8 = iVar1;
      if (pVVar7->nSize < 2) goto LAB_0037265a;
      piVar8[1] = iVar2;
      uVar4 = Wlc_ObjAlloc(pNtk,(int)local_b8,local_bc,local_ac,0);
      sprintf(local_98,"_n%d_",(ulong)uVar4);
      uVar5 = Abc_NamStrFindOrAdd(pNtk->pManName,local_98,&local_c0);
      if (local_c0 != 0) {
        __assert_fail("!fFound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x16b,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      if (uVar4 != uVar5) {
        __assert_fail("iObj == NameId",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x16c,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      if (((int)uVar4 < 1) || (pNtk->nObjsAlloc <= (int)uVar4)) goto LAB_0037263b;
      Wlc_ObjAddFanins(pNtk,pNtk->pObjs + uVar4,pVVar7);
      Vec_IntPush(vFanins,uVar4);
      bVar3 = iVar11 <= vFanins->nSize;
      iVar11 = vFanins->nSize;
      if (bVar3) {
        __assert_fail("new_size<old_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x173,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
    }
    piVar8 = pVVar7->pArray;
    pName = local_a8;
  }
  if (piVar8 != (int *)0x0) {
    free(piVar8);
  }
  free(pVVar7);
  if ((int)local_b8 - 9U < 3) {
    if (vFanins->nSize < 2) {
      __assert_fail("Vec_IntSize(vFanins)>=2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                    ,0x182,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)")
      ;
    }
    iVar11 = vFanins->pArray[1];
    lVar10 = (long)iVar11;
    if ((lVar10 < 1) || (pNtk->nObjsAlloc <= iVar11)) goto LAB_0037263b;
    uVar5 = pNtk->pObjs[lVar10].End - pNtk->pObjs[lVar10].Beg;
    uVar4 = -uVar5;
    if (0 < (int)uVar5) {
      uVar4 = uVar5;
    }
    if (0x1f < uVar4) {
      local_a8 = pName;
      pVVar7 = (Vec_Int_t *)malloc(0x10);
      pVVar7->nCap = 0x10;
      pVVar7->nSize = 0;
      piVar8 = (int *)malloc(0x40);
      pVVar7->pArray = piVar8;
      Vec_IntPush(pVVar7,iVar11);
      Vec_IntPush(pVVar7,0x1e);
      Vec_IntPush(pVVar7,0);
      uVar5 = Wlc_ObjAlloc(pNtk,0x16,0,0x1e,0);
      sprintf(local_98,"_n%d_",(ulong)uVar5);
      uVar6 = Abc_NamStrFindOrAdd(pNtk->pManName,local_98,&local_c0);
      if (local_c0 != 0) {
        __assert_fail("!fFound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,400,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)")
        ;
      }
      if (uVar5 != uVar6) {
        __assert_fail("iObj1 == NameId",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x191,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      if (((int)uVar5 < 1) || (pNtk->nObjsAlloc <= (int)uVar5)) goto LAB_0037263b;
      Wlc_ObjAddFanins(pNtk,pNtk->pObjs + uVar5,pVVar7);
      iVar11 = pVVar7->nSize;
      if (iVar11 < 1) {
LAB_00372752:
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
      }
      pVVar7->nSize = iVar11 + -1;
      local_ac = uVar5;
      if (iVar11 + -1 == 0) goto LAB_00372752;
      pVVar7->nSize = iVar11 + -2;
      Vec_IntPush(pVVar7,uVar4);
      Vec_IntPush(pVVar7,0x1f);
      uVar4 = Wlc_ObjAlloc(pNtk,0x16,0,uVar4,0x1f);
      sprintf(local_98,"_n%d_",(ulong)uVar4);
      uVar5 = Abc_NamStrFindOrAdd(pNtk->pManName,local_98,&local_c0);
      if (local_c0 != 0) {
        __assert_fail("!fFound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x1a0,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      if (uVar4 != uVar5) {
        __assert_fail("iObj2 == NameId",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x1a1,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      if (((int)uVar4 < 1) || (pNtk->nObjsAlloc <= (int)uVar4)) goto LAB_0037263b;
      Wlc_ObjAddFanins(pNtk,pNtk->pObjs + uVar4,pVVar7);
      iVar11 = pVVar7->nSize;
      if (iVar11 < 1) goto LAB_00372752;
      pVVar7->nSize = iVar11 + -1;
      if (iVar11 + -1 == 0) goto LAB_00372752;
      pVVar7->nSize = iVar11 + -2;
      if (iVar11 + -2 == 0) {
LAB_0037265a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *pVVar7->pArray = uVar4;
      uVar4 = Wlc_ObjAlloc(pNtk,0x26,0,0,0);
      sprintf(local_98,"_n%d_",(ulong)uVar4);
      uVar5 = Abc_NamStrFindOrAdd(pNtk->pManName,local_98,&local_c0);
      if (local_c0 != 0) {
        __assert_fail("!fFound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x1af,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      if (uVar4 != uVar5) {
        __assert_fail("iObj3 == NameId",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x1b0,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      if (((int)uVar4 < 1) || (pNtk->nObjsAlloc <= (int)uVar4)) goto LAB_0037263b;
      Wlc_ObjAddFanins(pNtk,pNtk->pObjs + uVar4,pVVar7);
      if (pVVar7->nSize < 1) goto LAB_0037265a;
      *pVVar7->pArray = uVar4;
      Vec_IntPush(pVVar7,local_ac);
      uVar4 = Wlc_ObjAlloc(pNtk,0x17,0,0x1f,0);
      sprintf(local_98,"_n%d_",(ulong)uVar4);
      uVar5 = Abc_NamStrFindOrAdd(pNtk->pManName,local_98,&local_c0);
      pName = local_a8;
      if (local_c0 != 0) {
        __assert_fail("!fFound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x1bd,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      if (uVar4 != uVar5) {
        __assert_fail("iObj == NameId",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x1be,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      if (((int)uVar4 < 1) || (pNtk->nObjsAlloc <= (int)uVar4)) goto LAB_0037263b;
      Wlc_ObjAddFanins(pNtk,pNtk->pObjs + uVar4,pVVar7);
      if (vFanins->nSize < 2) goto LAB_0037265a;
      vFanins->pArray[1] = uVar4;
      if (pVVar7->pArray != (int *)0x0) {
        free(pVVar7->pArray);
      }
      free(pVVar7);
    }
  }
  uVar4 = Wlc_ObjAlloc(pNtk,(int)local_b8,local_bc,(int)local_a0 + -1,0);
  if (pName == (char *)0x0) {
    pName = local_98;
    sprintf(pName,"_n%d_",(ulong)uVar4);
  }
  uVar5 = Abc_NamStrFindOrAdd(pNtk->pManName,pName,&local_c0);
  if (local_c0 != 0) {
    __assert_fail("!fFound",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                  ,0x1d2,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
  }
  if (uVar4 != uVar5) {
    __assert_fail("iObj == NameId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                  ,0x1d3,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
  }
  if ((0 < (int)uVar4) && ((int)uVar4 < pNtk->nObjsAlloc)) {
    Wlc_ObjAddFanins(pNtk,pNtk->pObjs + uVar4,vFanins);
    if (local_bc != 0) {
      if (pNtk->nObjsAlloc <= (int)uVar4) goto LAB_0037263b;
      *(ushort *)(pNtk->pObjs + uVar4) =
           (ushort)*(undefined4 *)(pNtk->pObjs + uVar4) & 0xffbf | (ushort)((local_bc & 1) << 6);
    }
    return uVar4;
  }
LAB_0037263b:
  __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
}

Assistant:

static inline int Smt_PrsCreateNode( Wlc_Ntk_t * pNtk, int Type, int fSigned, int Range, Vec_Int_t * vFanins, char * pName )
{
    char Buffer[100];
    char * pNameFanin;
    int NameId, fFound, old_size, new_size;
    int iObj, iFanin0, iFanin1; 
    Vec_Int_t * v2Fanins = Vec_IntStartFull(2);
    
    assert( Type > 0 );
    assert( Range >= 0 );
    assert( fSigned >= 0 );
    
    //if (Vec_IntSize(vFanins)<=2 || Type == WLC_OBJ_BIT_CONCAT || Type == WLC_OBJ_MUX )
    // explicitely secify allowed multi operators
    if (Vec_IntSize(vFanins)<=2 || 
        !( Type == WLC_OBJ_BIT_AND ||       // 16:`` bitwise AND
          Type == WLC_OBJ_BIT_OR ||        // 17: bitwise OR
          Type == WLC_OBJ_BIT_XOR ||       // 18: bitwise XOR
          Type == WLC_OBJ_BIT_NAND ||      // 19: bitwise AND
          Type == WLC_OBJ_BIT_NOR ||       // 20: bitwise OR
          Type == WLC_OBJ_BIT_NXOR ||      // 21: bitwise NXOR

          Type == WLC_OBJ_LOGIC_IMPL ||    // 27: logic implication
          Type == WLC_OBJ_LOGIC_AND ||     // 28: logic AND
          Type == WLC_OBJ_LOGIC_OR ||      // 29: logic OR
          Type == WLC_OBJ_LOGIC_XOR ||     // 30: logic XOR
          Type == WLC_OBJ_COMP_EQU ||      // 31: compare equal
//          Type == WLC_OBJ_COMP_NOTEQU ||   // 32: compare not equal -- bug fix
          Type == WLC_OBJ_COMP_LESS ||     // 33: compare less
          Type == WLC_OBJ_COMP_MORE ||     // 34: compare more
          Type == WLC_OBJ_COMP_LESSEQU ||  // 35: compare less or equal
          Type == WLC_OBJ_COMP_MOREEQU || // 36: compare more or equal

          Type == WLC_OBJ_ARI_ADD ||       // 43: arithmetic addition
          Type == WLC_OBJ_ARI_SUB ||       // 44: arithmetic subtraction
          Type == WLC_OBJ_ARI_MULTI ||     // 45: arithmetic multiplier
          Type == WLC_OBJ_ARI_DIVIDE       // 46: arithmetic division 
        ))
        goto FINISHED_WITH_FANINS;

    // we will be creating nodes backwards. this way we can pop from vFanins easier
    while (Vec_IntSize(vFanins)>2)
    {
        // getting 2 fanins at a time
        old_size = Vec_IntSize(vFanins);
        iFanin0 = Vec_IntPop(vFanins);
        iFanin1 = Vec_IntPop(vFanins);
        
        Vec_IntWriteEntry(v2Fanins,0,iFanin0);
        Vec_IntWriteEntry(v2Fanins,1,iFanin1);
        
        iObj = Wlc_ObjAlloc( pNtk, Type, fSigned, Range-1, 0 );
        sprintf( Buffer, "_n%d_", iObj );
        pNameFanin = Buffer;
        NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pNameFanin, &fFound );
        
        assert( !fFound );
        assert( iObj == NameId );
        
        Wlc_ObjAddFanins( pNtk, Wlc_NtkObj(pNtk, iObj), v2Fanins );
        
        // pushing the new node
        Vec_IntPush(vFanins, iObj);
        new_size = Vec_IntSize(vFanins);
        assert(new_size<old_size);
    }
    
FINISHED_WITH_FANINS:

    Vec_IntFree(v2Fanins);
    
    //added to deal with long shifts create extra bit select (ROTATE as well ??)
    // this is a temporary hack
    // basically we keep only 32 bits. 
    // bit[31] will be the copy of original MSB (sign bit, just in case) UPDATE: assume it is unsigned first????
    // bit[31] will be the reduction or of any bits from [31] to Range
    if (Type == WLC_OBJ_SHIFT_R || Type == WLC_OBJ_SHIFT_RA || Type == WLC_OBJ_SHIFT_L)
    {
        int range1, iObj1, iObj2, iObj3;
        assert(Vec_IntSize(vFanins)>=2);
        iFanin1 = Vec_IntEntry(vFanins,1);
        range1 = Wlc_ObjRange( Wlc_NtkObj(pNtk, iFanin1) );
        if (range1>32)
        {
            Vec_Int_t * newFanins = Vec_IntAlloc(10);
            Vec_IntPush(newFanins,iFanin1);
            Vec_IntPushTwo( newFanins, 30, 0 );
            
            iObj1 = Wlc_ObjAlloc( pNtk, WLC_OBJ_BIT_SELECT, 0, 30, 0 );
            sprintf( Buffer, "_n%d_", iObj1 );
            pNameFanin = Buffer;
            NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pNameFanin, &fFound );
        
            assert( !fFound );
            assert( iObj1 == NameId );
        
            Wlc_ObjAddFanins( pNtk, Wlc_NtkObj(pNtk, iObj1), newFanins );
            
            //printf("obj1: %d\n",iObj1);
            
            // bit select of larger bits
            Vec_IntPop(newFanins);
            Vec_IntPop(newFanins);
            Vec_IntPushTwo( newFanins, range1-1, 31 );
            iObj2 = Wlc_ObjAlloc( pNtk, WLC_OBJ_BIT_SELECT, 0, range1-1, 31 );
            sprintf( Buffer, "_n%d_", iObj2 );
            pNameFanin = Buffer;
            NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pNameFanin, &fFound );
        
            assert( !fFound );
            assert( iObj2 == NameId );
        
            Wlc_ObjAddFanins( pNtk, Wlc_NtkObj(pNtk, iObj2), newFanins );
            //printf("obj2: %d\n",iObj2);
            
            // reduction or
            Vec_IntPop( newFanins );
            Vec_IntPop( newFanins );
            Vec_IntWriteEntry( newFanins, 0, iObj2 );
            iObj3 = Wlc_ObjAlloc( pNtk, WLC_OBJ_REDUCT_OR, 0, 0, 0 );
            sprintf( Buffer, "_n%d_", iObj3 );
            pNameFanin = Buffer;
            NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pNameFanin, &fFound );
        
            assert( !fFound );
            assert( iObj3 == NameId );
        
            Wlc_ObjAddFanins( pNtk, Wlc_NtkObj(pNtk, iObj3), newFanins );
            //printf("obj3: %d\n",iObj3);
        
            // concat all together
            Vec_IntWriteEntry( newFanins, 0, iObj3 );
            Vec_IntPush( newFanins, iObj1 );
            iObj = Wlc_ObjAlloc( pNtk, WLC_OBJ_BIT_CONCAT, 0, 31, 0 );
            sprintf( Buffer, "_n%d_", iObj );
            pNameFanin = Buffer;
            NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pNameFanin, &fFound );
        
            assert( !fFound );
            assert( iObj == NameId );
        
            Wlc_ObjAddFanins( pNtk, Wlc_NtkObj(pNtk, iObj), newFanins );
            //printf("obj: %d\n",iObj);
        
            // pushing the new node
            Vec_IntWriteEntry(vFanins, 1, iObj);
            Vec_IntFree(newFanins);
        }
    }
    
    iObj = Wlc_ObjAlloc( pNtk, Type, fSigned, Range-1, 0 );
    
    // add node's name
    if ( pName == NULL )
    {
        sprintf( Buffer, "_n%d_", iObj );
        pName = Buffer;
    }
    NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pName, &fFound );
    assert( !fFound );
    assert( iObj == NameId );
    
    Wlc_ObjAddFanins( pNtk, Wlc_NtkObj(pNtk, iObj), vFanins );
    if ( fSigned )
    {
        Wlc_NtkObj(pNtk, iObj)->Signed = fSigned;
//        if ( Vec_IntSize(vFanins) > 0 )
//            Wlc_NtkObj(pNtk, Vec_IntEntry(vFanins, 0))->Signed = fSigned;
//        if ( Vec_IntSize(vFanins) > 1 )
//            Wlc_NtkObj(pNtk, Vec_IntEntry(vFanins, 1))->Signed = fSigned;
    }
        
    return iObj;
}